

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool op_mlal(DisasContext_conflict1 *s,arg_s_rrrr *a,_Bool uns,_Bool add)

{
  TCGContext_conflict1 *tcg_ctx;
  undefined1 extraout_AL;
  TCGv_i32 rl;
  TCGv_i32 rh;
  TCGv_i32 bl;
  TCGv_i32 bh;
  undefined7 in_register_00000011;
  uintptr_t o;
  uintptr_t o_1;
  
  tcg_ctx = s->uc->tcg_ctx;
  rl = load_reg(s,a->rm);
  rh = load_reg(s,a->rn);
  if ((int)CONCAT71(in_register_00000011,uns) == 0) {
    tcg_gen_muls2_i32_aarch64(tcg_ctx,rl,rh,rl,rh);
  }
  else {
    tcg_gen_mulu2_i32_aarch64(tcg_ctx,rl,rh,rl,rh);
  }
  if (add) {
    bl = load_reg(s,a->ra);
    bh = load_reg(s,a->rd);
    tcg_gen_add2_i32_aarch64(tcg_ctx,rl,rh,rl,rh,bl,bh);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(bl + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(bh + (long)tcg_ctx));
  }
  if (a->s != 0) {
    tcg_gen_mov_i32(tcg_ctx,tcg_ctx->cpu_NF,rh);
    tcg_gen_or_i32(tcg_ctx,tcg_ctx->cpu_ZF,rl,rh);
  }
  store_reg(s,a->ra,rl);
  store_reg(s,a->rd,rh);
  return (_Bool)extraout_AL;
}

Assistant:

static bool op_mlal(DisasContext *s, arg_s_rrrr *a, bool uns, bool add)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t0, t1, t2, t3;

    t0 = load_reg(s, a->rm);
    t1 = load_reg(s, a->rn);
    if (uns) {
        tcg_gen_mulu2_i32(tcg_ctx, t0, t1, t0, t1);
    } else {
        tcg_gen_muls2_i32(tcg_ctx, t0, t1, t0, t1);
    }
    if (add) {
        t2 = load_reg(s, a->ra);
        t3 = load_reg(s, a->rd);
        tcg_gen_add2_i32(tcg_ctx, t0, t1, t0, t1, t2, t3);
        tcg_temp_free_i32(tcg_ctx, t2);
        tcg_temp_free_i32(tcg_ctx, t3);
    }
    if (a->s) {
        gen_logicq_cc(tcg_ctx, t0, t1);
    }
    store_reg(s, a->ra, t0);
    store_reg(s, a->rd, t1);
    return true;
}